

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

int clause2_create_new(sat_solver2 *s,lit *begin,lit *end,int learnt,int proof_id)

{
  ABC_INT64_T *pAVar1;
  int *piVar2;
  veci *pvVar3;
  int iVar4;
  int iVar5;
  int **ppiVar6;
  int *piVar7;
  veci *pvVar8;
  byte bVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint *puVar20;
  bool bVar21;
  
  uVar15 = (uint)((ulong)((long)end - (long)begin) >> 2);
  if (0 < (int)uVar15) {
    uVar13 = *begin;
    if ((int)uVar13 < 0) {
      __assert_fail("size < 1 || begin[0] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                    ,0x19c,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    if (uVar15 == 1) {
      if (s->size <= (int)(uVar13 >> 1)) {
LAB_004d7a31:
        __assert_fail("size < 1 || lit_var(begin[0]) < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                      ,0x19e,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
      }
    }
    else {
      if (begin[1] < 0) {
        __assert_fail("size < 2 || begin[1] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                      ,0x19d,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
      }
      if (s->size <= (int)(uVar13 >> 1)) goto LAB_004d7a31;
      if (s->size <= begin[1] >> 1) {
        __assert_fail("size < 2 || lit_var(begin[1]) < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                      ,0x19f,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
      }
    }
  }
  uVar13 = uVar15 + 3 & 0xfffffffe;
  iVar11 = 1 << ((byte)(s->Mem).nPageSize & 0x1f);
  if (iVar11 <= (int)(uVar13 + 3)) {
    __assert_fail("nInts + 3 < (1 << p->nPageSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satClause.h"
                  ,0x132,"int Sat_MemAppend(Sat_Mem_t *, int *, int, int, int)");
  }
  ppiVar6 = (s->Mem).pPages;
  iVar4 = (s->Mem).iPage[(uint)learnt];
  piVar7 = ppiVar6[iVar4];
  iVar5 = *piVar7;
  if (iVar11 <= (int)(uVar13 + iVar5 + 2)) {
    iVar4 = iVar4 + 2;
    (s->Mem).iPage[(uint)learnt] = iVar4;
    iVar11 = (s->Mem).nPagesAlloc;
    if (iVar11 <= iVar4) {
      ppiVar6 = (int **)realloc(ppiVar6,(long)iVar11 << 4);
      (s->Mem).pPages = ppiVar6;
      iVar11 = (s->Mem).nPagesAlloc;
      memset(ppiVar6 + iVar11,0,(long)iVar11 << 3);
      (s->Mem).nPagesAlloc = iVar11 * 2;
      iVar4 = (s->Mem).iPage[(uint)learnt];
    }
    piVar7 = ppiVar6[iVar4];
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(1 << ((byte)(s->Mem).nPageSize & 0x1f)) << 2);
      ppiVar6[iVar4] = piVar7;
      piVar7 = (s->Mem).pPages[iVar4];
    }
    *piVar7 = 2;
    iVar5 = 2;
  }
  piVar7[iVar5] = 0;
  puVar20 = (uint *)(piVar7 + *piVar7);
  *puVar20 = learnt & 1U | *puVar20 & 0x7fe | uVar15 << 0xb;
  if (begin != (lit *)0x0) {
    memcpy(puVar20 + 1,begin,((long)end - (long)begin) * 0x40000000 >> 0x1e & 0xfffffffffffffffc);
  }
  uVar14 = (s->Mem).nEntries[(uint)learnt];
  puVar20[(ulong)(uVar15 & 0x1fffff) + 1] = uVar14;
  (s->Mem).nEntries[(uint)learnt] = uVar14 + 1;
  *piVar7 = *piVar7 + uVar13;
  iVar11 = (s->Mem).iPage[(uint)learnt];
  bVar9 = (byte)(s->Mem).nPageSize;
  ppiVar6 = (s->Mem).pPages;
  uVar14 = iVar11 << (bVar9 & 0x1f) | *ppiVar6[iVar11];
  if ((uVar14 & 1) != 0) {
    __assert_fail("!(h & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                  ,0x1a2,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  uVar14 = uVar14 - uVar13;
  if (uVar14 == 0) {
    puVar20 = (uint *)0x0;
  }
  else {
    uVar13 = (s->Mem).uPageMask & uVar14;
    if (uVar13 == 0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satClause.h"
                    ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
    }
    puVar20 = (uint *)(ppiVar6[(int)uVar14 >> (bVar9 & 0x1f)] + (int)uVar13);
  }
  if (learnt == 0) {
    if (puVar20[(ulong)(*puVar20 >> 0xb) + 1] != (s->stats).clauses) {
      __assert_fail("clause_id(c) == (int)s->stats.clauses",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                    ,0x1b7,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    (s->stats).clauses = puVar20[(ulong)(*puVar20 >> 0xb) + 1] + 1;
    pAVar1 = &(s->stats).clauses_literals;
    *pAVar1 = *pAVar1 + (long)(int)uVar15;
  }
  else {
    if ((proof_id == 0) && (s->pPrf1 != (Vec_Set_t *)0x0)) {
      __assert_fail("proof_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                    ,0x1a7,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    uVar13 = *puVar20;
    if (uVar13 < 0x800) {
      uVar12 = 0;
      uVar17 = 0;
    }
    else {
      uVar12 = (ulong)(uVar13 >> 0xb);
      uVar16 = 0;
      uVar17 = 0;
      uVar18 = 0;
      do {
        uVar19 = 1 << ((byte)s->levels[(int)puVar20[uVar16 + 1] >> 1] & 0x1f);
        bVar21 = (uVar18 >> (s->levels[(int)puVar20[uVar16 + 1] >> 1] & 0x1fU) & 1) != 0;
        if (bVar21) {
          uVar19 = 0;
        }
        uVar17 = (uVar17 + 1) - (uint)bVar21;
        uVar18 = uVar18 | uVar19;
        uVar16 = uVar16 + 1;
      } while (uVar12 != uVar16);
      uVar17 = (uVar17 & 0xff) << 3;
    }
    *puVar20 = uVar13 & 0xfffff807 | uVar17;
    uVar13 = puVar20[uVar12 + 1];
    if (uVar13 != (s->act_clas).size) {
      __assert_fail("clause_id(c) == veci_size(&s->act_clas)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                    ,0x1a9,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    if ((s->pPrf1 != (Vec_Set_t *)0x0) || (s->pInt2 != (Int2_Man_t *)0x0)) {
      uVar13 = (s->claProofs).size;
      if (uVar13 == (s->claProofs).cap) {
        iVar11 = (uVar13 >> 1) * 3;
        if ((int)uVar13 < 4) {
          iVar11 = uVar13 * 2;
        }
        piVar7 = (s->claProofs).ptr;
        if (piVar7 == (int *)0x0) {
          piVar7 = (int *)malloc((long)iVar11 << 2);
        }
        else {
          piVar7 = (int *)realloc(piVar7,(long)iVar11 << 2);
        }
        (s->claProofs).ptr = piVar7;
        if (piVar7 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->claProofs).cap * 9.5367431640625e-07,
                 (double)iVar11 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->claProofs).cap = iVar11;
        uVar13 = (s->claProofs).size;
      }
      (s->claProofs).size = uVar13 + 1;
      (s->claProofs).ptr[(int)uVar13] = proof_id;
      uVar13 = (s->act_clas).size;
    }
    if (uVar13 == (s->act_clas).cap) {
      iVar11 = (uVar13 >> 1) * 3;
      if ((int)uVar13 < 4) {
        iVar11 = uVar13 * 2;
      }
      piVar7 = (s->act_clas).ptr;
      if (piVar7 == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar11 << 2);
      }
      else {
        piVar7 = (int *)realloc(piVar7,(long)iVar11 << 2);
      }
      (s->act_clas).ptr = piVar7;
      if (piVar7 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->act_clas).cap * 9.5367431640625e-07,(double)iVar11 * 9.5367431640625e-07)
        ;
        fflush(_stdout);
      }
      (s->act_clas).cap = iVar11;
      uVar13 = (s->act_clas).size;
    }
    piVar7 = (s->act_clas).ptr;
    (s->act_clas).size = uVar13 + 1;
    piVar7[(int)uVar13] = 0;
    if (2 < (int)uVar15) {
      uVar13 = puVar20[(ulong)(*puVar20 >> 0xb) + 1];
      if (((long)(int)uVar13 < 0) || ((s->act_clas).size <= (int)uVar13)) {
        __assert_fail("Id >= 0 && Id < veci_size(&s->act_clas)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                      ,0x17e,"void act_clause2_bump(sat_solver2 *, clause *)");
      }
      piVar2 = piVar7 + (int)uVar13;
      *piVar2 = *piVar2 + s->cla_inc;
      if (*piVar2 < 0) {
        if (0 < (s->act_clas).size) {
          lVar10 = 0;
          do {
            piVar7[lVar10] = (uint)piVar7[lVar10] >> 0xe;
            lVar10 = lVar10 + 1;
          } while (lVar10 < (s->act_clas).size);
        }
        iVar5 = s->cla_inc >> 0xe;
        iVar11 = 0x400;
        if (0x400 < iVar5) {
          iVar11 = iVar5;
        }
        s->cla_inc = iVar11;
      }
    }
    puVar20 = &(s->stats).learnts;
    *puVar20 = *puVar20 + 1;
    pAVar1 = &(s->stats).learnts_literals;
    *pAVar1 = *pAVar1 + (long)(int)uVar15;
    s->hLearntLast = uVar14;
  }
  if (1 < (int)uVar15) {
    uVar12 = (long)*begin ^ 1;
    pvVar8 = s->wlists;
    pvVar3 = pvVar8 + uVar12;
    uVar15 = pvVar8[uVar12].size;
    if (uVar15 == pvVar8[uVar12].cap) {
      iVar11 = (uVar15 >> 1) * 3;
      if ((int)uVar15 < 4) {
        iVar11 = uVar15 * 2;
      }
      if (pvVar3->ptr == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar11 << 2);
      }
      else {
        piVar7 = (int *)realloc(pvVar3->ptr,(long)iVar11 << 2);
      }
      pvVar3->ptr = piVar7;
      if (piVar7 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pvVar3->cap * 9.5367431640625e-07,(double)iVar11 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      pvVar3->cap = iVar11;
      uVar15 = pvVar3->size;
      pvVar8 = s->wlists;
    }
    pvVar3->size = uVar15 + 1;
    pvVar3->ptr[(int)uVar15] = uVar14;
    uVar12 = (long)begin[1] ^ 1;
    pvVar3 = pvVar8 + uVar12;
    uVar15 = pvVar8[uVar12].size;
    if (uVar15 == pvVar8[uVar12].cap) {
      iVar11 = (uVar15 >> 1) * 3;
      if ((int)uVar15 < 4) {
        iVar11 = uVar15 * 2;
      }
      if (pvVar3->ptr == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar11 << 2);
      }
      else {
        piVar7 = (int *)realloc(pvVar3->ptr,(long)iVar11 << 2);
      }
      pvVar3->ptr = piVar7;
      if (piVar7 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pvVar3->cap * 9.5367431640625e-07,(double)iVar11 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      pvVar3->cap = iVar11;
      uVar15 = pvVar3->size;
    }
    pvVar3->size = uVar15 + 1;
    pvVar3->ptr[(int)uVar15] = uVar14;
  }
  return uVar14;
}

Assistant:

static int clause2_create_new(sat_solver2* s, lit* begin, lit* end, int learnt, int proof_id )
{
    clause* c;
    int h, size = end - begin;
    assert(size < 1 || begin[0] >= 0);
    assert(size < 2 || begin[1] >= 0);
    assert(size < 1 || lit_var(begin[0]) < s->size);
    assert(size < 2 || lit_var(begin[1]) < s->size);
    // create new clause
    h = Sat_MemAppend( &s->Mem, begin, size, learnt, 1 );
    assert( !(h & 1) );
    c = clause2_read( s, h );
    if (learnt)
    {
        if ( s->pPrf1 )
            assert( proof_id );
        c->lbd = sat_clause_compute_lbd( s, c );
        assert( clause_id(c) == veci_size(&s->act_clas) );
        if ( s->pPrf1 || s->pInt2 )
            veci_push(&s->claProofs, proof_id);
//        veci_push(&s->act_clas, (1<<10));
        veci_push(&s->act_clas, 0);
        if ( size > 2 )
            act_clause2_bump( s,c );
        s->stats.learnts++;
        s->stats.learnts_literals += size;
        // remember the last one
        s->hLearntLast = h;
    }
    else
    {
        assert( clause_id(c) == (int)s->stats.clauses );
        s->stats.clauses++;
        s->stats.clauses_literals += size;
    }
    // watch the clause
    if ( size > 1 )
    {
        veci_push(solver2_wlist(s,lit_neg(begin[0])),h);
        veci_push(solver2_wlist(s,lit_neg(begin[1])),h);
    }
    return h;
}